

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int32_t zng_inflateValidate(zng_stream *strm,int32_t check)

{
  internal_state *piVar1;
  int iVar2;
  int in_ESI;
  zng_stream *in_RDI;
  inflate_state *state;
  int32_t local_4;
  
  iVar2 = inflateStateCheck(in_RDI);
  if (iVar2 == 0) {
    piVar1 = in_RDI->state;
    if ((in_ESI == 0) || (*(int *)&piVar1->pending_out == 0)) {
      *(uint *)&piVar1->pending_out = *(uint *)&piVar1->pending_out & 0xfffffffb;
    }
    else {
      *(uint *)&piVar1->pending_out = *(uint *)&piVar1->pending_out | 4;
    }
    local_4 = 0;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateValidate)(PREFIX3(stream) *strm, int32_t check) {
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    if (check && state->wrap)
        state->wrap |= 4;
    else
        state->wrap &= ~4;
    return Z_OK;
}